

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O0

void __thiscall
CmdLineArgsParser::ParseNumberTrioSet(CmdLineArgsParser *this,NumberTrioSet *numberTrioSet)

{
  char16 cVar1;
  uint32 x;
  undefined4 local_24;
  undefined4 local_20;
  int stmt;
  int col;
  int line;
  NumberTrioSet *numberTrioSet_local;
  CmdLineArgsParser *this_local;
  
  while( true ) {
    x = ParseInteger(this);
    local_20 = 0xffffffff;
    local_24 = 0xffffffff;
    cVar1 = CurChar(this);
    if (cVar1 == L',') {
      NextChar(this);
      local_20 = ParseInteger(this);
    }
    cVar1 = CurChar(this);
    if (cVar1 == L',') {
      NextChar(this);
      local_24 = ParseInteger(this);
    }
    Js::NumberTrioSet::Add(numberTrioSet,x,local_20,local_24);
    cVar1 = CurChar(this);
    if (cVar1 != L';') break;
    NextChar(this);
  }
  return;
}

Assistant:

void
CmdLineArgsParser::ParseNumberTrioSet(Js::NumberTrioSet * numberTrioSet)
{
    while (true)
    {
        int line = ParseInteger();
        int col = -1;
        int stmt = -1;
        if (CurChar() == ',')
        {
            NextChar();
            col = ParseInteger();
        }
        if (CurChar() == ',')
        {
            NextChar();
            stmt = ParseInteger();
        }

        numberTrioSet->Add(line, col, stmt);

        if (CurChar() != ';')
        {
            break;
        }
        NextChar();
    }
}